

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::ConvertToHalfPass::ProcessImpl(ConvertToHalfPass *this)

{
  bool bVar1;
  uint32_t id;
  Status SVar2;
  IRContext *pIVar3;
  reference puVar4;
  Instruction *this_00;
  uint32_t v_id;
  Instruction *val;
  iterator __end2_1;
  iterator __begin2_1;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_1;
  _Node_iterator_base<unsigned_int,_false> _Stack_58;
  uint c_id;
  iterator __end2;
  iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  anon_class_8_1_8991fb9c aStack_38;
  bool modified;
  undefined1 local_30 [8];
  ProcessFunction pfn;
  ConvertToHalfPass *this_local;
  
  aStack_38.this = this;
  pfn._M_invoker = (_Invoker_type)this;
  std::function<bool(spvtools::opt::Function*)>::
  function<spvtools::opt::ConvertToHalfPass::ProcessImpl()::__0,void>
            ((function<bool(spvtools::opt::Function*)> *)local_30,&stack0xffffffffffffffc8);
  pIVar3 = Pass::context(&this->super_Pass);
  __range2._7_1_ = IRContext::ProcessReachableCallTree(pIVar3,(ProcessFunction *)local_30);
  if (__range2._7_1_) {
    pIVar3 = Pass::context(&this->super_Pass);
    IRContext::AddCapability(pIVar3,Float16);
  }
  __end2 = std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin(&this->relaxed_ids_set_);
  _Stack_58._M_cur =
       (__node_type *)
       std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::end(&this->relaxed_ids_set_);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                       &stack0xffffffffffffffa8);
    if (!bVar1) break;
    puVar4 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end2);
    bVar1 = RemoveRelaxedDecoration(this,*puVar4);
    __range2._7_1_ = __range2._7_1_ != false || bVar1;
    std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end2);
  }
  Pass::get_module(&this->super_Pass);
  Module::types_values((Module *)&__begin2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&val);
  while( true ) {
    bVar1 = utils::operator!=(&__end2_1.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&val);
    if (!bVar1) break;
    this_00 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator*(&__end2_1.super_iterator);
    id = Instruction::result_id(this_00);
    if (id != 0) {
      bVar1 = RemoveRelaxedDecoration(this,id);
      __range2._7_1_ = __range2._7_1_ != false || bVar1;
    }
    InstructionList::iterator::operator++(&__end2_1);
  }
  SVar2 = SuccessWithoutChange;
  if (__range2._7_1_ != false) {
    SVar2 = SuccessWithChange;
  }
  std::function<bool_(spvtools::opt::Function_*)>::~function
            ((function<bool_(spvtools::opt::Function_*)> *)local_30);
  return SVar2;
}

Assistant:

Pass::Status ConvertToHalfPass::ProcessImpl() {
  Pass::ProcessFunction pfn = [this](Function* fp) {
    return ProcessFunction(fp);
  };
  bool modified = context()->ProcessReachableCallTree(pfn);
  // If modified, make sure module has Float16 capability
  if (modified) context()->AddCapability(spv::Capability::Float16);
  // Remove all RelaxedPrecision decorations from instructions and globals
  for (auto c_id : relaxed_ids_set_) {
    modified |= RemoveRelaxedDecoration(c_id);
  }
  for (auto& val : get_module()->types_values()) {
    uint32_t v_id = val.result_id();
    if (v_id != 0) {
      modified |= RemoveRelaxedDecoration(v_id);
    }
  }
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}